

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void fprint_stone_identifier(FILE *out,event_path_data evp,int stone_num)

{
  uint in_EDX;
  long in_RSI;
  FILE *in_RDI;
  int i;
  int global_stone_num;
  int local_stone_num;
  int local_20;
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((in_EDX & 0x80000000) == 0x80000000) {
    uVar1 = in_EDX;
    in_EDX = lookup_local_stone((event_path_data)CONCAT44(in_EDX,0xffffffff),-1);
  }
  else {
    for (local_20 = 0; local_20 < *(int *)(in_RSI + 0x10); local_20 = local_20 + 1) {
      if (*(uint *)(*(long *)(in_RSI + 0x18) + 4 + (long)local_20 * 8) == in_EDX) {
        uVar1 = *(uint *)(*(long *)(in_RSI + 0x18) + (long)local_20 * 8);
        break;
      }
    }
  }
  fprintf(in_RDI,"local stone number %x",(ulong)in_EDX);
  if (uVar1 != 0xffffffff) {
    fprintf(in_RDI," (global %x)",(ulong)uVar1);
  }
  return;
}

Assistant:

static void
fprint_stone_identifier(FILE *out, event_path_data evp, int stone_num)
{
    int local_stone_num = -1;
    int global_stone_num = -1;
    if ((stone_num & 0x80000000) == 0x80000000) {
	local_stone_num = lookup_local_stone(evp, stone_num);
	global_stone_num = stone_num;
    } else {
	int i;
	local_stone_num = stone_num;
	for (i=0; i < evp->stone_lookup_table_size; i++) {
	    if (evp->stone_lookup_table[i].local_id == stone_num) {
		global_stone_num = evp->stone_lookup_table[i].global_id;
		break;
	    }
	}
    }
    fprintf(out, "local stone number %x", local_stone_num);
    if (global_stone_num != -1) {
	fprintf(out, " (global %x)", global_stone_num);
    }
}